

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O2

void Assimp::FBX::TokenizeBinary(TokenList *output_tokens,char *input,size_t length)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  char *end;
  allocator local_49;
  char *cursor;
  
  if (length < 0x1b) {
    std::__cxx11::string::string((string *)&cursor,"file is too short",&local_49);
    anon_unknown_3::TokenizeError((string *)&cursor,0);
  }
  iVar2 = strncmp(input,"Kaydara FBX Binary",0x12);
  if (iVar2 == 0) {
    cursor = input + 0x12;
    end = input + length;
    anon_unknown_3::ReadByte(input,&cursor,end);
    anon_unknown_3::ReadByte(input,&cursor,end);
    anon_unknown_3::ReadByte(input,&cursor,end);
    anon_unknown_3::ReadByte(input,&cursor,end);
    anon_unknown_3::ReadByte(input,&cursor,end);
    uVar3 = anon_unknown_3::ReadWord(input,&cursor,end);
    if (cursor < end) {
      do {
        bVar1 = anon_unknown_3::ReadScope(output_tokens,input,&cursor,end,0x1d4b < uVar3);
        if (!bVar1) {
          return;
        }
      } while (cursor < end);
    }
    return;
  }
  std::__cxx11::string::string((string *)&cursor,"magic bytes not found",&local_49);
  anon_unknown_3::TokenizeError((string *)&cursor,0);
}

Assistant:

void TokenizeBinary(TokenList& output_tokens, const char* input, size_t length)
{
    ai_assert(input);

    if(length < 0x1b) {
        TokenizeError("file is too short",0);
    }

    //uint32_t offset = 0x15;
/*    const char* cursor = input + 0x15;

    const uint32_t flags = ReadWord(input, cursor, input + length);

    const uint8_t padding_0 = ReadByte(input, cursor, input + length); // unused
    const uint8_t padding_1 = ReadByte(input, cursor, input + length); // unused*/

    if (strncmp(input,"Kaydara FBX Binary",18)) {
        TokenizeError("magic bytes not found",0);
    }

    const char* cursor = input + 18;
	/*Result ignored*/ ReadByte(input, cursor, input + length);
	/*Result ignored*/ ReadByte(input, cursor, input + length);
	/*Result ignored*/ ReadByte(input, cursor, input + length);
	/*Result ignored*/ ReadByte(input, cursor, input + length);
	/*Result ignored*/ ReadByte(input, cursor, input + length);
	const uint32_t version = ReadWord(input, cursor, input + length);
	const bool is64bits = version >= 7500;
    const char *end = input + length;
    while (cursor < end ) {
		if (!ReadScope(output_tokens, input, cursor, input + length, is64bits)) {
            break;
        }
    }
}